

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLinActuator.cpp
# Opt level: O1

void __thiscall chrono::ChLinkLinActuator::UpdateTime(ChLinkLinActuator *this,double mytime)

{
  Coordsys *pCVar1;
  double dVar2;
  double dVar3;
  ChMarker *pCVar4;
  ChMarker *pCVar5;
  double dVar6;
  bool bVar7;
  char cVar8;
  ulong *puVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  double dVar17;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar18;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  ChMatrix33<double> ma;
  Coordsys newmarkpos;
  ChMatrix33<double> local_90;
  Coordsys local_48;
  undefined1 auVar39 [16];
  
  ChLinkLockLock::UpdateTime(&this->super_ChLinkLockLock,mytime);
  pCVar4 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2;
  pCVar4->motion_type = M_MOTION_EXTERNAL;
  ChMatrix33<double>::ChMatrix33(&local_90,&(pCVar4->abs_frame).super_ChFrame<double>.coord.rot);
  pCVar4 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker1;
  pCVar5 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2;
  dVar20 = (pCVar4->abs_frame).super_ChFrame<double>.coord.pos.m_data[0] -
           (pCVar5->abs_frame).super_ChFrame<double>.coord.pos.m_data[0];
  dVar21 = (pCVar4->abs_frame).super_ChFrame<double>.coord.pos.m_data[1] -
           (pCVar5->abs_frame).super_ChFrame<double>.coord.pos.m_data[1];
  dVar19 = (pCVar4->abs_frame).super_ChFrame<double>.coord.pos.m_data[2] -
           (pCVar5->abs_frame).super_ChFrame<double>.coord.pos.m_data[2];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar21 * dVar21;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar20;
  auVar22 = vfmadd231sd_fma(auVar22,auVar36,auVar36);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar19;
  auVar22 = vfmadd231sd_fma(auVar22,auVar41,auVar41);
  auVar30._0_8_ = auVar22._0_8_;
  if (auVar30._0_8_ < 0.0) {
    dVar17 = sqrt(auVar30._0_8_);
  }
  else {
    auVar22 = vsqrtsd_avx(auVar22,auVar22);
    dVar17 = auVar22._0_8_;
  }
  bVar7 = 2.2250738585072014e-308 <= dVar17;
  dVar17 = 1.0 / dVar17;
  dVar21 = (double)((ulong)bVar7 * (long)(dVar21 * dVar17));
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar21;
  auVar12._0_8_ =
       (double)((ulong)bVar7 * (long)(dVar20 * dVar17) + (ulong)!bVar7 * 0x3ff0000000000000);
  auVar12._8_8_ = 0;
  dVar20 = (double)((ulong)bVar7 * (long)(dVar19 * dVar17));
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar20;
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       local_90.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       local_90.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       local_90.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  if ((local_90.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] ==
       auVar12._0_8_) &&
     (!NAN(local_90.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1])
      && !NAN(auVar12._0_8_))) {
    if ((local_90.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] ==
         dVar21) &&
       (!NAN(local_90.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4])
        && !NAN(dVar21))) {
      if ((local_90.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] ==
           dVar20) &&
         (!NAN(local_90.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [7]) && !NAN(dVar20))) {
        if ((auVar12._0_8_ != 1.0) || (NAN(auVar12._0_8_))) {
          puVar9 = &VECT_X;
        }
        else {
          puVar9 = &VECT_Y;
        }
        auVar23._8_8_ = 0;
        auVar23._0_8_ = *puVar9;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = puVar9[1];
        auVar37._8_8_ = 0;
        auVar37._0_8_ = puVar9[2];
      }
    }
  }
  auVar42._8_8_ = 0;
  auVar42._0_8_ = auVar32._0_8_ * dVar20;
  auVar36 = vfmsub231sd_fma(auVar42,auVar11,auVar37);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = auVar37._0_8_ * auVar12._0_8_;
  auVar22 = vfmsub231sd_fma(auVar38,auVar13,auVar23);
  dVar19 = auVar22._0_8_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = auVar23._0_8_ * dVar21;
  auVar41 = vfmsub231sd_fma(auVar43,auVar12,auVar32);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar19 * dVar19;
  auVar22 = vfmadd231sd_fma(auVar24,auVar36,auVar36);
  auVar22 = vfmadd231sd_fma(auVar22,auVar41,auVar41);
  if (auVar22._0_8_ < 0.0) {
    dVar17 = sqrt(auVar22._0_8_);
  }
  else {
    auVar22 = vsqrtsd_avx(auVar22,auVar22);
    dVar17 = auVar22._0_8_;
  }
  bVar7 = 2.2250738585072014e-308 <= dVar17;
  dVar17 = 1.0 / dVar17;
  dVar19 = (double)((ulong)bVar7 * (long)(dVar19 * dVar17));
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar19;
  auVar15._0_8_ =
       (double)((ulong)bVar7 * (long)(auVar36._0_8_ * dVar17) + (ulong)!bVar7 * 0x3ff0000000000000);
  auVar15._8_8_ = 0;
  dVar17 = (double)((ulong)bVar7 * (long)(auVar41._0_8_ * dVar17));
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar17;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar17 * dVar21;
  auVar36 = vfmsub231sd_fma(auVar33,auVar14,auVar13);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = auVar15._0_8_ * dVar20;
  auVar22 = vfmsub231sd_fma(auVar39,auVar12,auVar16);
  dVar35 = auVar22._0_8_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar19 * auVar12._0_8_;
  auVar41 = vfmsub231sd_fma(auVar44,auVar11,auVar15);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar35 * dVar35;
  auVar22 = vfmadd231sd_fma(auVar25,auVar36,auVar36);
  auVar22 = vfmadd231sd_fma(auVar22,auVar41,auVar41);
  if (auVar22._0_8_ < 0.0) {
    dVar18 = sqrt(auVar22._0_8_);
  }
  else {
    auVar22 = vsqrtsd_avx(auVar22,auVar22);
    dVar18 = auVar22._0_8_;
  }
  bVar7 = 2.2250738585072014e-308 <= dVar18;
  dVar18 = 1.0 / dVar18;
  local_90.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       (double)((ulong)bVar7 * (long)(dVar18 * dVar35));
  dVar10 = (double)((ulong)bVar7 * (long)(dVar18 * auVar36._0_8_) +
                   (ulong)!bVar7 * 0x3ff0000000000000);
  dVar35 = (double)((ulong)bVar7 * (long)(auVar41._0_8_ * dVar18));
  local_48.pos.m_data[2] = 0.0;
  local_48.pos.m_data[0] = 0.0;
  local_48.pos.m_data[1] = 0.0;
  local_48.rot.m_data[0] = 1.0;
  local_48.rot.m_data[1] = 0.0;
  local_48.rot.m_data[2] = 0.0;
  local_48.rot.m_data[3] = 0.0;
  pCVar4 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2;
  if (&(pCVar4->abs_frame).super_ChFrame<double>.coord != &local_48) {
    local_48.pos.m_data[0] = (pCVar4->abs_frame).super_ChFrame<double>.coord.pos.m_data[0];
    local_48.pos.m_data[1] = (pCVar4->abs_frame).super_ChFrame<double>.coord.pos.m_data[1];
    local_48.pos.m_data[2] = (pCVar4->abs_frame).super_ChFrame<double>.coord.pos.m_data[2];
  }
  dVar18 = (pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  dVar2 = (pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  dVar3 = (pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  dVar6 = dVar17 + auVar12._0_8_ +
                   local_90.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[4];
  local_90.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar12._0_8_;
  local_90.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = dVar10;
  local_90.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar15._0_8_;
  local_90.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = dVar21;
  local_90.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = dVar19;
  local_90.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = dVar20;
  local_90.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = dVar35;
  local_90.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = dVar17;
  if (0.0 <= dVar6) {
    dVar6 = dVar6 + 1.0;
    if (dVar6 < 0.0) {
      local_48.rot.m_data[3] = sqrt(dVar6);
    }
    else {
      auVar26._8_8_ = 0;
      auVar26._0_8_ = dVar6;
      auVar22 = vsqrtsd_avx(auVar26,auVar26);
      local_48.rot.m_data[3] = auVar22._0_8_;
    }
    local_48.rot.m_data[0] = local_48.rot.m_data[3] * 0.5;
    local_48.rot.m_data[3] = 0.5 / local_48.rot.m_data[3];
    local_48.rot.m_data[1] = (dVar35 - dVar19) * local_48.rot.m_data[3];
    local_48.rot.m_data[2] = (auVar15._0_8_ - dVar20) * local_48.rot.m_data[3];
    local_48.rot.m_data[3] = (dVar21 - dVar10) * local_48.rot.m_data[3];
  }
  else {
    cVar8 = auVar12._0_8_ <
            local_90.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    dVar6 = auVar12._0_8_;
    if ((bool)cVar8) {
      dVar6 = local_90.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]
      ;
    }
    if (dVar6 < dVar17) {
      cVar8 = '\x02';
    }
    if (cVar8 == '\x02') {
      dVar17 = ((dVar17 - auVar12._0_8_) -
               local_90.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4]) + 1.0;
      if (dVar17 < 0.0) {
        local_48.rot.m_data[0] = sqrt(dVar17);
      }
      else {
        auVar28._8_8_ = 0;
        auVar28._0_8_ = dVar17;
        auVar22 = vsqrtsd_avx(auVar28,auVar28);
        local_48.rot.m_data[0] = auVar22._0_8_;
      }
      local_48.rot.m_data[3] = local_48.rot.m_data[0] * 0.5;
      local_48.rot.m_data[0] = 0.5 / local_48.rot.m_data[0];
      local_48.rot.m_data[1] = (auVar15._0_8_ + dVar20) * local_48.rot.m_data[0];
      local_48.rot.m_data[2] = (dVar19 + dVar35) * local_48.rot.m_data[0];
      dVar20 = dVar21 - dVar10;
    }
    else if (cVar8 == '\x01') {
      dVar17 = ((local_90.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4] - dVar17) - auVar12._0_8_) + 1.0;
      if (dVar17 < 0.0) {
        local_48.rot.m_data[0] = sqrt(dVar17);
      }
      else {
        auVar27._8_8_ = 0;
        auVar27._0_8_ = dVar17;
        auVar22 = vsqrtsd_avx(auVar27,auVar27);
        local_48.rot.m_data[0] = auVar22._0_8_;
      }
      local_48.rot.m_data[2] = local_48.rot.m_data[0] * 0.5;
      local_48.rot.m_data[0] = 0.5 / local_48.rot.m_data[0];
      local_48.rot.m_data[3] = (dVar19 + dVar35) * local_48.rot.m_data[0];
      local_48.rot.m_data[1] = (dVar21 + dVar10) * local_48.rot.m_data[0];
      dVar20 = auVar15._0_8_ - dVar20;
    }
    else {
      dVar17 = ((auVar12._0_8_ -
                local_90.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4]) - dVar17) + 1.0;
      if (dVar17 < 0.0) {
        local_48.rot.m_data[0] = sqrt(dVar17);
      }
      else {
        auVar29._8_8_ = 0;
        auVar29._0_8_ = dVar17;
        auVar22 = vsqrtsd_avx(auVar29,auVar29);
        local_48.rot.m_data[0] = auVar22._0_8_;
      }
      local_48.rot.m_data[1] = local_48.rot.m_data[0] * 0.5;
      local_48.rot.m_data[0] = 0.5 / local_48.rot.m_data[0];
      local_48.rot.m_data[2] = (dVar21 + dVar10) * local_48.rot.m_data[0];
      local_48.rot.m_data[3] = (auVar15._0_8_ + dVar20) * local_48.rot.m_data[0];
      dVar20 = dVar35 - dVar19;
    }
    local_48.rot.m_data[0] = dVar20 * local_48.rot.m_data[0];
  }
  ChMarker::Impose_Abs_Coord
            ((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2,&local_48);
  pCVar4 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2;
  (pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0] = dVar18;
  (pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1] = dVar2;
  (pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2] = dVar3;
  if (this != (ChLinkLinActuator *)(sBulletDNAstr64 + 0x2850)) {
    (this->super_ChLinkLockLock).deltaC.pos.m_data[0] = VNULL;
    (this->super_ChLinkLockLock).deltaC.pos.m_data[1] = DAT_00b90ac0;
    (this->super_ChLinkLockLock).deltaC.pos.m_data[2] = DAT_00b90ac8;
  }
  dVar20 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.
           super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime;
  (*((this->dist_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  (this->super_ChLinkLockLock).deltaC.pos.m_data[0] = dVar20 + this->offset;
  if (this != (ChLinkLinActuator *)(sBulletDNAstr64 + 0x2818)) {
    (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[0] = VNULL;
    (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[1] = DAT_00b90ac0;
    (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[2] = DAT_00b90ac8;
  }
  dVar20 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.
           super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime;
  (*((this->dist_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[5])();
  (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[0] = dVar20;
  pCVar1 = &(this->super_ChLinkLockLock).deltaC_dtdt;
  if (pCVar1 != (Coordsys *)&VNULL) {
    (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[0] = VNULL;
    (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[1] = DAT_00b90ac0;
    (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[2] = DAT_00b90ac8;
  }
  dVar20 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.
           super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime;
  (*((this->dist_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[6])();
  (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[0] = dVar20;
  dVar20 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.relM_dt.pos.m_data[1];
  dVar21 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.relM_dt.pos.m_data[2];
  auVar30._8_8_ = 0;
  if (auVar30._0_8_ < 0.0) {
    dVar19 = sqrt(auVar30._0_8_);
  }
  else {
    auVar22 = vsqrtsd_avx(auVar30,auVar30);
    dVar19 = auVar22._0_8_;
  }
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar21;
  if (1e-06 < dVar19) {
    auVar31._8_8_ = 0;
    auVar31._0_8_ = dVar20 * dVar20;
    auVar22 = vfmadd213sd_fma(auVar40,auVar40,auVar31);
    if (auVar22._0_8_ < 0.0) {
      dVar20 = sqrt(auVar22._0_8_);
    }
    else {
      auVar22 = vsqrtsd_avx(auVar22,auVar22);
      dVar20 = auVar22._0_8_;
    }
    auVar34._8_8_ = 0;
    auVar34._0_8_ = auVar30._0_8_;
    if (auVar30._0_8_ < 0.0) {
      dVar21 = sqrt(auVar30._0_8_);
    }
    else {
      auVar22 = vsqrtsd_avx(auVar34,auVar34);
      dVar21 = auVar22._0_8_;
    }
    (pCVar1->pos).m_data[0] = (pCVar1->pos).m_data[0] - (dVar20 * dVar20) / dVar21;
  }
  if (this != (ChLinkLinActuator *)(sBulletDNAstr64 + 0x26f0)) {
    (this->super_ChLinkLockLock).deltaC.rot.m_data[0] = QUNIT;
    (this->super_ChLinkLockLock).deltaC.rot.m_data[1] = DAT_00b90978;
    (this->super_ChLinkLockLock).deltaC.rot.m_data[2] = DAT_00b90980;
    (this->super_ChLinkLockLock).deltaC.rot.m_data[3] = DAT_00b90988;
  }
  if (this != (ChLinkLinActuator *)(sBulletDNAstr64 + 0x2698)) {
    (this->super_ChLinkLockLock).deltaC_dt.rot.m_data[0] = QNULL;
    (this->super_ChLinkLockLock).deltaC_dt.rot.m_data[1] = DAT_00b90958;
    (this->super_ChLinkLockLock).deltaC_dt.rot.m_data[2] = DAT_00b90960;
    (this->super_ChLinkLockLock).deltaC_dt.rot.m_data[3] = DAT_00b90968;
  }
  if (this != (ChLinkLinActuator *)(sBulletDNAstr64 + 0x2660)) {
    (this->super_ChLinkLockLock).deltaC_dtdt.rot.m_data[0] = QNULL;
    (this->super_ChLinkLockLock).deltaC_dtdt.rot.m_data[1] = DAT_00b90958;
    (this->super_ChLinkLockLock).deltaC_dtdt.rot.m_data[2] = DAT_00b90960;
    (this->super_ChLinkLockLock).deltaC_dtdt.rot.m_data[3] = DAT_00b90968;
  }
  return;
}

Assistant:

void ChLinkLinActuator::UpdateTime(double mytime) {
    // First, inherit to parent class
    ChLinkLockLock::UpdateTime(mytime);

    // Move (well, rotate...) marker 2 to align it in actuator direction

    // ! Require that the BDF routine of marker won't handle speed and acc.calculus of the moved marker 2!
    marker2->SetMotionType(ChMarker::M_MOTION_EXTERNAL);

    ChMatrix33<> ma(marker2->GetAbsCoord().rot);

    Vector absdist = Vsub(marker1->GetAbsCoord().pos, marker2->GetAbsCoord().pos);

    Vector mx = Vnorm(absdist);

    Vector my = ma.Get_A_Yaxis();
    if (Vequal(mx, my)) {
        if (mx.x() == 1.0)
            my = VECT_Y;
        else
            my = VECT_X;
    }
    Vector mz = Vnorm(Vcross(mx, my));
    my = Vnorm(Vcross(mz, mx));

    ma.Set_A_axis(mx, my, mz);

    Coordsys newmarkpos;
    ChVector<> oldpos = marker2->GetPos();  // backup to avoid numerical err.accumulation
    newmarkpos.pos = marker2->GetAbsCoord().pos;
    newmarkpos.rot = ma.Get_A_quaternion();
    marker2->Impose_Abs_Coord(newmarkpos);  // rotate "main" marker2 into tangent position (may add err.accumulation)
    marker2->SetPos(oldpos);                // backup to avoid numerical err.accumulation

    // imposed relative positions/speeds
    deltaC.pos = VNULL;
    deltaC.pos.x() = dist_funct->Get_y(ChTime) + offset;  // distance is always on M2 'X' axis

    deltaC_dt.pos = VNULL;
    deltaC_dt.pos.x() = dist_funct->Get_y_dx(ChTime);  // distance speed

    deltaC_dtdt.pos = VNULL;
    deltaC_dtdt.pos.x() = dist_funct->Get_y_dxdx(ChTime);  // distance acceleration

    // add also the centripetal acceleration if distance vector's rotating,
    // as centripetal acc. of point sliding on a sphere surface.
    Vector tang_speed = GetRelM_dt().pos;
    tang_speed.x() = 0;                     // only z-y coords in relative tang speed vector
    double len_absdist = Vlength(absdist);  // don't divide by zero
    if (len_absdist > 1E-6)
        deltaC_dtdt.pos.x() -= pow(Vlength(tang_speed), 2) / Vlength(absdist);  // An = Adelta -(Vt^2 / r)

    deltaC.rot = QUNIT;  // no relative rotations imposed!
    deltaC_dt.rot = QNULL;
    deltaC_dtdt.rot = QNULL;
}